

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O1

void inithess_l(double *H,int N,int k,double *tsk,double *tyk,double *dx)

{
  double *C;
  double *C_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  mmult(tsk,tyk,C,1,N,1);
  mmult(tyk,tyk,C_00,1,N,1);
  if (k < 1) {
    dVar4 = 1.0;
  }
  else {
    dVar4 = *C / *C_00;
  }
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    uVar2 = 0;
    do {
      uVar3 = 0;
      do {
        dVar5 = 0.0;
        if (uVar2 == uVar3) {
          dVar5 = dVar4 * dx[uVar2] * dx[uVar2];
        }
        H[uVar3] = dVar5;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      uVar2 = uVar2 + 1;
      H = H + uVar1;
    } while (uVar2 != uVar1);
  }
  free(C);
  free(C_00);
  return;
}

Assistant:

void inithess_l(double *H, int N, int k, double *tsk,double *tyk, double *dx) {
	int i, j, ct;
	double temp;
	double *num, *den;

	num = (double*)malloc(sizeof(double)*1);
	den = (double*)malloc(sizeof(double)*1);

	mmult(tsk, tyk, num, 1, N, 1);
	mmult(tyk, tyk, den, 1, N, 1);

	if (k > 0) {
		temp = num[0] / den[0];
	}
	else {
		temp = 1.0;
	}

	for (i = 0; i < N; ++i) {
		ct = i *N;
		for (j = 0; j < N; ++j) {
			if (i == j) {
				H[ct + j] = temp * dx[i] * dx[i];
			}
			else {
				H[ct + j] = 0.0;
			}

		}
	}

	free(num);
	free(den);

}